

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O2

int act_mod_nims(nt_opts *opts)

{
  int iVar1;
  nifti_image *nim;
  size_t sVar2;
  long lVar3;
  char func [13];
  
  builtin_strncpy(func + 8,"nims",5);
  builtin_strncpy(func,"act_mod_",8);
  if (2 < g_debug) {
    fprintf(_stderr,"-d modifying %d fields for %d nifti images...\n",(ulong)(uint)(opts->flist).len
            ,(ulong)(uint)(opts->infiles).len);
  }
  if ((0 < (opts->flist).len) && (iVar1 = (opts->infiles).len, 0 < iVar1)) {
    for (lVar3 = 0; lVar3 < iVar1; lVar3 = lVar3 + 1) {
      nim = nt_image_read(opts,(opts->infiles).list[lVar3],1);
      if (1 < g_debug) {
        fprintf(_stderr,"-d modifying %d fields from \'%s\' image\n",(ulong)(uint)(opts->flist).len,
                (opts->infiles).list[lVar3]);
      }
      iVar1 = modify_all_fields(nim,opts,g_nim_fields,0x3f);
      if (iVar1 != 0) {
LAB_0010892b:
        nifti_image_free(nim);
        return 1;
      }
      if (opts->keep_hist != 0) {
        sVar2 = strlen(opts->command);
        iVar1 = nifti_add_extension(nim,opts->command,(int)sVar2,6);
        if (iVar1 != 0) {
          fwrite("** failed to add command to image as extension\n",0x2f,1,_stderr);
        }
      }
      if ((opts->prefix != (char *)0x0) &&
         (iVar1 = nifti_set_filenames(nim,opts->prefix,1,1), iVar1 != 0)) {
        fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",func,"failed to set prefix for new file: ",
                opts->prefix);
        goto LAB_0010892b;
      }
      nifti_image_write(nim);
      nifti_image_free(nim);
      iVar1 = (opts->infiles).len;
    }
  }
  return 0;
}

Assistant:

int act_mod_nims( nt_opts * opts )
{
   nifti_image    * nim;         /* for reading/writing entire datasets */
   int              filec;
   char             func[] = { "act_mod_nims" };

   if( g_debug > 2 )
      fprintf(stderr,"-d modifying %d fields for %d nifti images...\n",
              opts->flist.len, opts->infiles.len);
   if( opts->flist.len <= 0 || opts->infiles.len <= 0 ) return 0;

   for( filec = 0; filec < opts->infiles.len; filec++ )
   {
      nim = nt_image_read(opts, opts->infiles.list[filec], 1); /* with data */

      if( g_debug > 1 )
         fprintf(stderr,"-d modifying %d fields from '%s' image\n",
                 opts->flist.len, opts->infiles.list[filec]);

      /* okay, let's actually trash the data fields */
      if( modify_all_fields(nim, opts, g_nim_fields, NT_NIM_NUM_FIELDS) )
      {
         nifti_image_free(nim);
         return 1;
      }

      /* add command as COMMENT extension */
      if( opts->keep_hist && nifti_add_extension(nim, opts->command,
                             strlen(opts->command), NIFTI_ECODE_COMMENT) )
         fprintf(stderr,"** failed to add command to image as extension\n");

      /* possibly duplicate the current dataset before writing new header */
      if( opts->prefix )
         if( nifti_set_filenames(nim, opts->prefix, 1, 1) )
         {
            NTL_FERR(func,"failed to set prefix for new file: ",opts->prefix);
            nifti_image_free(nim);
            return 1;
         }

      nifti_image_write(nim);  /* and write it out, piece of cake :) */
      nifti_image_free(nim);
   }

   return 0;
}